

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O3

void __thiscall
embree::Texture::Texture(Texture *this,uint width,uint height,Format format,char *in)

{
  uint uVar1;
  void *__s;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  
  this->width = width;
  this->height = height;
  this->format = format;
  uVar1 = getFormatBytesPerTexel(format);
  this->bytesPerTexel = uVar1;
  this->width_mask = 0;
  this->height_mask = 0;
  this->data = (void *)0x0;
  (this->fileName)._M_dataplus._M_p = (pointer)&(this->fileName).field_2;
  (this->fileName)._M_string_length = 0;
  (this->fileName).field_2._M_local_buf[0] = '\0';
  uVar3 = width;
  do {
    uVar4 = uVar3;
    if (uVar4 < 2) break;
    uVar3 = uVar4 >> 1;
  } while ((uVar4 & 1) == 0);
  uVar3 = 0;
  if (uVar4 == 1) {
    uVar3 = width - 1;
  }
  this->width_mask = uVar3;
  uVar3 = height;
  do {
    uVar4 = uVar3;
    if (uVar4 < 2) break;
    uVar3 = uVar4 >> 1;
  } while ((uVar4 & 1) == 0);
  uVar3 = 0;
  if (uVar4 == 1) {
    uVar3 = height - 1;
  }
  this->height_mask = uVar3;
  iVar5 = width * height;
  __s = alignedUSMMalloc((ulong)(uVar1 * iVar5),0x10,DEVICE_READ_ONLY);
  this->data = __s;
  uVar3 = this->bytesPerTexel * iVar5;
  if (in != (char *)0x0) {
    if (uVar3 != 0) {
      uVar2 = 0;
      do {
        *(char *)((long)this->data + uVar2) = in[uVar2];
        uVar2 = uVar2 + 1;
      } while (uVar2 < this->bytesPerTexel * iVar5);
    }
    return;
  }
  memset(__s,0,(ulong)uVar3);
  return;
}

Assistant:

Texture::Texture (unsigned width, unsigned height, const Format format, const char* in)
    : width(width), height(height), format(format), bytesPerTexel(getFormatBytesPerTexel(format)), width_mask(0), height_mask(0), data(nullptr)
  {
    width_mask  = isPowerOf2(width) ? width-1 : 0;
    height_mask = isPowerOf2(height) ? height-1 : 0;

    data = alignedUSMMalloc(bytesPerTexel*width*height,16);
    if (in) {
      for (size_t i=0; i<bytesPerTexel*width*height; i++)
	((char*)data)[i] = in[i];
    }
    else {
      memset(data,0 ,bytesPerTexel*width*height);
    }   
  }